

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

void __thiscall sensors_analytics::DefaultConsumer::Close(DefaultConsumer *this)

{
  pthread_mutex_t *__mutex;
  HttpSender *pHVar1;
  pointer pcVar2;
  
  __mutex = &this->records_mutex_;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  LoadRecordFromDisk(this);
  DumpRecordToDisk(this);
  pHVar1 = this->sender_;
  if (pHVar1 != (HttpSender *)0x0) {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&pHVar1->http_headers_);
    pcVar2 = (pHVar1->server_url_)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pHVar1->server_url_).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pHVar1);
    this->sender_ = (HttpSender *)0x0;
  }
  pthread_mutex_destroy((pthread_mutex_t *)&this->sending_mutex_);
  pthread_mutex_destroy((pthread_mutex_t *)__mutex);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void DefaultConsumer::Close() {
  LockGuard records_lock(&records_mutex_);
  LoadRecordFromDisk();
  DumpRecordToDisk();
  if (sender_ != NULL) {
    delete sender_;
    sender_ = NULL;
  }
  SA_MUTEX_DESTROY(&sending_mutex_);
  SA_MUTEX_DESTROY(&records_mutex_);
}